

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O0

char * QtPrivate::QTypeNormalizer::skipString(char *x,char *e)

{
  bool bVar1;
  char delim;
  char *e_local;
  char *x_local;
  
  x_local = x + 1;
  while( true ) {
    bVar1 = false;
    if (x_local != e) {
      bVar1 = *x_local != *x;
    }
    if (!bVar1) break;
    if ((*x_local == '\\') && (x_local = x_local + 1, x_local == e)) {
      return e;
    }
    x_local = x_local + 1;
  }
  if (x_local != e) {
    x_local = x_local + 1;
  }
  return x_local;
}

Assistant:

static constexpr const char *skipString(const char *x, const char *e)
    {
        char delim = *x;
        x++;
        while (x != e && *x != delim) {
            if (*x == '\\') {
                x++;
                if (x == e)
                    return e;
            }
            x++;
        }
        if (x != e)
            x++;
        return x;
    }